

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

_Bool monster_can_cast(monster *mon,_Bool innate)

{
  loc_conflict grid2;
  loc_conflict grid;
  loc_conflict grid2_00;
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict *gp;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t ipath;
  wchar_t npath;
  loc_conflict *path;
  wchar_t wStack_28;
  loc_conflict tgrid;
  wchar_t tdist;
  wchar_t chance;
  _Bool innate_local;
  monster *mon_local;
  
  if (innate) {
    local_44 = mon->race->freq_innate;
  }
  else {
    local_44 = mon->race->freq_spell;
  }
  tgrid.y = local_44;
  monster_get_target_dist_grid(mon,&tgrid.x,(loc_conflict *)((long)&path + 4));
  _Var1 = flag_has_dbg(mon->mflag,2,3,"mon->mflag","MFLAG_NICE");
  if (_Var1) {
    mon_local._7_1_ = false;
  }
  else if (tgrid.y == L'\0') {
    mon_local._7_1_ = false;
  }
  else {
    if (player->timed[0x30] != 0) {
      tgrid.y = tgrid.y / 2;
    }
    if (tgrid.x == (uint)mon->best_range) {
      tgrid.y = tgrid.y << 1;
    }
    wVar2 = Rand_div(100);
    if (wVar2 < tgrid.y) {
      if ((int)(uint)z_info->max_range < tgrid.x) {
        mon_local._7_1_ = false;
      }
      else {
        grid2.y = wStack_28;
        grid2.x = path._4_4_;
        _Var1 = projectable((chunk *)cave,mon->grid,grid2,L'\x2000');
        if (_Var1) {
          if ((((path._4_4_ != (player->grid).x) || (wStack_28 != (player->grid).y)) &&
              (_Var1 = square_isview((chunk *)cave,mon->grid), !_Var1)) &&
             (grid.y = wStack_28, grid.x = path._4_4_, _Var1 = square_isview((chunk *)cave,grid),
             !_Var1)) {
            gp = (loc_conflict *)mem_alloc((ulong)z_info->max_range << 3);
            grid2_00.y = wStack_28;
            grid2_00.x = path._4_4_;
            wVar2 = project_path((chunk *)cave,gp,(uint)z_info->max_range,mon->grid,grid2_00,
                                 L'\x2000');
            local_40 = L'\0';
            while( true ) {
              if (wVar2 <= local_40) {
                mem_free(gp);
                return false;
              }
              _Var1 = square_isview((chunk *)cave,gp[local_40]);
              if (_Var1) break;
              local_40 = local_40 + L'\x01';
            }
            mem_free(gp);
          }
          mon_local._7_1_ = true;
        }
        else {
          mon_local._7_1_ = false;
        }
      }
    }
    else {
      mon_local._7_1_ = false;
    }
  }
  return mon_local._7_1_;
}

Assistant:

static bool monster_can_cast(struct monster *mon, bool innate)
{
	int chance = innate ? mon->race->freq_innate : mon->race->freq_spell;
	int tdist;
	struct loc tgrid;

	monster_get_target_dist_grid(mon, &tdist, &tgrid);

	/* Cannot cast spells when nice */
	if (mflag_has(mon->mflag, MFLAG_NICE)) return false;

	/* Not allowed to cast spells */
	if (!chance) return false;

	/* Taunted monsters are likely just to attack */
	if (player->timed[TMD_TAUNT]) {
		chance /= 2;
	}

	/* Monsters at their preferred range are more likely to cast */
	if (tdist == mon->best_range) {
		chance *= 2;
	}

	/* Only do spells occasionally */
	if (randint0(100) >= chance) return false;

	/* Check range */
	if (tdist > z_info->max_range) return false;

	/* Check path */
	if (!projectable(cave, mon->grid, tgrid, PROJECT_SHORT))
		return false;

	/* If the target isn't the player, only cast if the player can witness */
	if ((tgrid.x != player->grid.x || tgrid.y != player->grid.y) &&
		!square_isview(cave, mon->grid) &&
		!square_isview(cave, tgrid)) {
		struct loc *path = mem_alloc(z_info->max_range * sizeof(*path));
		int npath, ipath;

		npath = project_path(cave, path, z_info->max_range, mon->grid,
			tgrid, PROJECT_SHORT);
		ipath = 0;
		while (1) {
			if (ipath >= npath) {
				/* No point on path visible.  Don't cast. */
				mem_free(path);
				return false;
			}
			if (square_isview(cave, path[ipath])) {
				break;
			}
			++ipath;
		}
		mem_free(path);
	}

	return true;
}